

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O2

err_t beltHash(octet *hash,void *src,size_t count)

{
  bool_t bVar1;
  size_t size;
  blob_t state;
  err_t eVar2;
  
  bVar1 = memIsValid(src,count);
  eVar2 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = memIsValid(hash,0x20);
    if (bVar1 != 0) {
      size = beltHash_keep();
      state = blobCreate(size);
      if (state == (blob_t)0x0) {
        eVar2 = 0x6e;
      }
      else {
        beltHashStart(state);
        beltHashStepH(src,count,state);
        beltHashStepG(hash,state);
        blobClose(state);
        eVar2 = 0;
      }
    }
  }
  return eVar2;
}

Assistant:

err_t beltHash(octet hash[32], const void* src, size_t count)
{
	void* state;
	// проверить входные данные
	if (!memIsValid(src, count) || !memIsValid(hash, 32))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltHash_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// вычислить хэш-значение
	beltHashStart(state);
	beltHashStepH(src, count, state);
	beltHashStepG(hash, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}